

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O2

void register_method_call(macro_interpreter_state *istate,uint32_t res)

{
  uint uVar1;
  obj *poVar2;
  _func_void_gpu_object_ptr_pushbuf_decode_state_ptr *p_Var3;
  pushbuf_decode_state local_58;
  
  local_58.skip = 0;
  local_58.next_command_offset = 0;
  local_58.long_command = 0;
  local_58.mthd = 0;
  local_58.mthd_data_available = 0;
  local_58.mthd_data = 0;
  local_58.incr = 0;
  local_58.subchan = 0;
  local_58.addr = 0;
  local_58.size = 0;
  poVar2 = istate->obj;
  uVar1 = istate->mthd;
  if ((ulong)uVar1 < 0x20000) {
    *(uint32_t *)((long)poVar2->data + (ulong)(uVar1 & 0xfffffffc)) = res;
  }
  else {
    fprintf(_stdout,"method 0x%x >= 0x%x\n",(ulong)uVar1,0x20000);
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
  }
  if (macro_rt_verbose == 0) {
    fprintf(_stdout,"PM: 0x%08x   %s.%s = %s",res,dec_obj,dec_mthd,dec_val);
    local_58.mthd = istate->mthd;
    local_58.mthd_data = res;
    local_58.fifo = istate->device;
    if ((poVar2->decoder != (gpu_object_decoder *)0x0) &&
       (p_Var3 = poVar2->decoder->decode_terse,
       p_Var3 != (_func_void_gpu_object_ptr_pushbuf_decode_state_ptr *)0x0)) {
      (*p_Var3)(poVar2->gpu_object,&local_58);
    }
    fprintf(_stdout,"%s\n","");
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
    if ((poVar2->decoder != (gpu_object_decoder *)0x0) &&
       (p_Var3 = poVar2->decoder->decode_verbose,
       p_Var3 != (_func_void_gpu_object_ptr_pushbuf_decode_state_ptr *)0x0)) {
      (*p_Var3)(poVar2->gpu_object,&local_58);
    }
  }
  return;
}

Assistant:

static void register_method_call(struct macro_interpreter_state *istate, uint32_t res)
{
	struct pushbuf_decode_state pstate = { 0 };
	struct obj *obj = istate->obj;

	if (istate->mthd < OBJECT_SIZE)
		obj->data[istate->mthd / 4] = res;
	else
		mmt_printf("method 0x%x >= 0x%x\n", istate->mthd, OBJECT_SIZE);

	if (macro_rt_verbose)
		return;

	mmt_printf("PM: 0x%08x   %s.%s = %s", res, dec_obj, dec_mthd, dec_val);

	pstate.mthd = istate->mthd;
	pstate.mthd_data = res;
	pstate.fifo = istate->device;

	if (obj->decoder && obj->decoder->decode_terse)
		obj->decoder->decode_terse(obj->gpu_object, &pstate);
	mmt_printf("%s\n", "");

	if (obj->decoder && obj->decoder->decode_verbose)
		obj->decoder->decode_verbose(obj->gpu_object, &pstate);
}